

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseTopLevelDeclContent(StructuralParser *this)

{
  bool bVar1;
  ProcessorBase *pPVar2;
  Namespace *parentNamespace;
  Graph *pGVar3;
  CompileMessage local_238;
  char *local_200;
  CompileMessage local_1f8;
  char *local_1c0;
  char *local_1b8;
  undefined1 local_1b0 [24];
  UTF8Reader local_198;
  undefined1 local_190 [8];
  CodeLocation keywordLocation_2;
  undefined1 local_158 [24];
  CompileMessage local_140;
  undefined4 local_104;
  pointer local_100;
  pointer local_f8;
  undefined1 local_f0 [8];
  CodeLocation keywordLocation_1;
  undefined1 local_d8 [24];
  UTF8Reader local_c0;
  undefined1 local_b8 [8];
  CodeLocation keywordLocation;
  pool_ptr<soul::AST::ModuleBase> local_50;
  pool_ptr<soul::AST::Namespace> local_48;
  pool_ptr<soul::AST::Namespace> ns;
  pool_ptr<soul::AST::Graph> local_38;
  pool_ptr<soul::AST::Graph> graph;
  pool_ptr<soul::AST::ModuleBase> local_20;
  pool_ptr<soul::AST::ProcessorBase> local_18;
  pool_ptr<soul::AST::ProcessorBase> processor;
  StructuralParser *this_local;
  
  processor.object = (ProcessorBase *)this;
  parseSpecialisationParameters(this);
  local_20.object = (this->module).object;
  cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_18,&local_20);
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_20);
  ns.object = (Namespace *)(this->module).object;
  cast<soul::AST::Graph,soul::AST::ModuleBase>
            ((soul *)&local_38,(pool_ptr<soul::AST::ModuleBase> *)&ns);
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&ns);
  local_50.object = (this->module).object;
  cast<soul::AST::Namespace,soul::AST::ModuleBase>((soul *)&local_48,&local_50);
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_50);
  bVar1 = pool_ptr<soul::AST::ProcessorBase>::operator!=(&local_18,(void *)0x0);
  if (bVar1) {
    pPVar2 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_18);
    parseAnnotation(this,&pPVar2->annotation);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"{");
  bVar1 = pool_ptr<soul::AST::ProcessorBase>::operator!=(&local_18,(void *)0x0);
  if (bVar1) {
    do {
      pPVar2 = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_18);
      bVar1 = parseEndpoint(this,pPVar2);
    } while (bVar1);
  }
  bVar1 = pool_ptr<soul::AST::Namespace>::operator!=(&local_48,(void *)0x0);
  if (bVar1) {
    parentNamespace = pool_ptr<soul::AST::Namespace>::operator*(&local_48);
    parseImports(this,parentNamespace);
  }
LAB_003f59ef:
  while( true ) {
    while( true ) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54ceac);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        giveErrorOnSemicolon(this);
        pool_ptr<soul::AST::Namespace>::~pool_ptr(&local_48);
        pool_ptr<soul::AST::Graph>::~pool_ptr(&local_38);
        pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_18);
        return;
      }
      bVar1 = pool_ptr<soul::AST::Graph>::operator!=(&local_38,(void *)0x0);
      if (bVar1) goto LAB_003f5a39;
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x5717af);
      if (!bVar1) break;
      parseStructDeclaration(this);
    }
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x571c05);
    if (!bVar1) break;
    bVar1 = pool_ptr<soul::AST::Namespace>::operator==(&local_48,(void *)0x0);
    if (bVar1) {
      Errors::graphMustBeInsideNamespace<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&keywordLocation.location);
      CompileMessage::~CompileMessage((CompileMessage *)&keywordLocation.location);
    }
    CodeLocation::CodeLocation((CodeLocation *)local_b8,&(this->super_SOULTokeniser).location);
    local_c0.data =
         (char *)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::skip(&this->super_SOULTokeniser);
    CodeLocation::CodeLocation((CodeLocation *)local_d8,(CodeLocation *)local_b8);
    pool_ptr<soul::AST::Namespace>::operator*(&local_48);
    parseGraphDecl((StructuralParser *)(local_d8 + 0x10),(CodeLocation *)this,(Namespace *)local_d8)
    ;
    pool_ptr<soul::AST::Graph>::~pool_ptr((pool_ptr<soul::AST::Graph> *)(local_d8 + 0x10));
    CodeLocation::~CodeLocation((CodeLocation *)local_d8);
    CodeLocation::~CodeLocation((CodeLocation *)local_b8);
  }
  goto LAB_003f5c6d;
LAB_003f5a39:
  pGVar3 = pool_ptr<soul::AST::Graph>::operator*(&local_38);
  bVar1 = parseProcessorInstanceList(this,pGVar3);
  if (!bVar1) {
    pGVar3 = pool_ptr<soul::AST::Graph>::operator*(&local_38);
    bVar1 = parseConnectionList(this,pGVar3);
    if (!bVar1) {
LAB_003f5c6d:
      keywordLocation_1.location.data = "processor";
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x570035);
      if (bVar1) {
        CodeLocation::CodeLocation((CodeLocation *)local_f0,&(this->super_SOULTokeniser).location);
        local_f8 = (pointer)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                            ::skip(&this->super_SOULTokeniser);
        local_100 = (pointer)0x548358;
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matches(&this->super_SOULTokeniser,(TokenType)0x548358);
        if (bVar1) {
          parseProcessorLatencyDeclaration(this);
        }
        else {
          bVar1 = pool_ptr<soul::AST::Namespace>::operator==(&local_48,(void *)0x0);
          if (bVar1) {
            Errors::processorMustBeInsideNamespace<>();
            (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_140);
            CompileMessage::~CompileMessage(&local_140);
          }
          CodeLocation::CodeLocation((CodeLocation *)local_158,(CodeLocation *)local_f0);
          pool_ptr<soul::AST::Namespace>::operator*(&local_48);
          parseProcessorDecl((StructuralParser *)(local_158 + 0x10),(CodeLocation *)this,
                             (Namespace *)local_158);
          pool_ptr<soul::AST::Processor>::~pool_ptr
                    ((pool_ptr<soul::AST::Processor> *)(local_158 + 0x10));
          CodeLocation::~CodeLocation((CodeLocation *)local_158);
        }
        local_104 = 4;
        CodeLocation::~CodeLocation((CodeLocation *)local_f0);
      }
      else {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"using");
        if (bVar1) {
          parseUsingDeclaration(this);
        }
        else {
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"let");
          if (bVar1) {
            parseTopLevelLetOrVar(this,true);
          }
          else {
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"var");
            if (bVar1) {
              parseTopLevelLetOrVar(this,false);
            }
            else {
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"event");
              if (bVar1) {
                parseEventFunction(this);
              }
              else {
                keywordLocation_2.location.data = "namespace";
                bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        ::matches(&this->super_SOULTokeniser,(TokenType)0x56fab0);
                if (bVar1) {
                  CodeLocation::CodeLocation
                            ((CodeLocation *)local_190,&(this->super_SOULTokeniser).location);
                  local_198.data =
                       (char *)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                               ::skip(&this->super_SOULTokeniser);
                  CodeLocation::CodeLocation((CodeLocation *)local_1b0,(CodeLocation *)local_190);
                  pool_ptr<soul::AST::ModuleBase>::operator*(&this->module);
                  parseNamespaceDecl((StructuralParser *)(local_1b0 + 0x10),(CodeLocation *)this,
                                     (ModuleBase *)local_1b0);
                  pool_ptr<soul::AST::Namespace>::~pool_ptr
                            ((pool_ptr<soul::AST::Namespace> *)(local_1b0 + 0x10));
                  CodeLocation::~CodeLocation((CodeLocation *)local_1b0);
                  local_104 = 4;
                  CodeLocation::~CodeLocation((CodeLocation *)local_190);
                }
                else {
                  local_1b8 = "input";
                  local_1c0 = "output";
                  bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          ::matchesAny<soul::TokenType,soul::TokenType>
                                    ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                                      *)this,(TokenType)0x54a795,(TokenType)0x5733cd);
                  if (bVar1) {
                    bVar1 = pool_ptr<soul::AST::Namespace>::operator!=(&local_48,(void *)0x0);
                    if (bVar1) {
                      Errors::namespaceCannotContainEndpoints<>();
                    }
                    else {
                      Errors::endpointDeclsMustBeFirst<>();
                    }
                    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_1f8);
                    CompileMessage::~CompileMessage(&local_1f8);
                  }
                  local_200 = "import";
                  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                          ::matches(&this->super_SOULTokeniser,(TokenType)"import");
                  if (bVar1) {
                    Errors::importsMustBeAtStart<>();
                    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_238);
                    CompileMessage::~CompileMessage(&local_238);
                  }
                  parseFunctionOrStateVariable(this);
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_003f59ef;
}

Assistant:

void parseTopLevelDeclContent()
    {
        parseSpecialisationParameters();

        auto processor = cast<AST::ProcessorBase> (module);
        auto graph     = cast<AST::Graph> (module);
        auto ns        = cast<AST::Namespace> (module);

        if (processor != nullptr)
            parseAnnotation (processor->annotation);

        expect (Operator::openBrace);

        if (processor != nullptr)
        {
            while (parseEndpoint (*processor))
            {}
        }

        if (ns != nullptr)
            parseImports (*ns);

        while (! matchIf (Operator::closeBrace))
        {
            if (graph != nullptr)
            {
                if (parseProcessorInstanceList (*graph)) continue;
                if (parseConnectionList (*graph))        continue;
            }
            else
            {
                if (matchIf (Keyword::struct_))         { parseStructDeclaration();  continue; }

                if (matches (Keyword::graph))
                {
                    if (ns == nullptr)
                        throwError (Errors::graphMustBeInsideNamespace());

                    auto keywordLocation = location;
                    skip();

                    parseGraphDecl (keywordLocation, *ns);
                    continue;
                }
            }

            if (matches (Keyword::processor))
            {
                auto keywordLocation = location;
                skip();

                if (matches (Operator::dot))
                {
                    parseProcessorLatencyDeclaration();
                    continue;
                }

                if (ns == nullptr)
                    throwError (Errors::processorMustBeInsideNamespace());

                parseProcessorDecl (keywordLocation, *ns);
                continue;
            }

            if (matchIf (Keyword::using_))          { parseUsingDeclaration();             continue; }
            if (matchIf (Keyword::let))             { parseTopLevelLetOrVar (true);        continue; }
            if (matchIf (Keyword::var))             { parseTopLevelLetOrVar (false);       continue; }
            if (matchIf (Keyword::event))           { parseEventFunction();                continue; }

            if (matches (Keyword::namespace_))
            {
                auto keywordLocation = location;
                skip();
                parseNamespaceDecl (keywordLocation, *module);
                continue;
            }

            if (matchesAny (Keyword::input, Keyword::output))
                throwError (ns != nullptr ? Errors::namespaceCannotContainEndpoints()
                                          : Errors::endpointDeclsMustBeFirst());

            if (matches (Keyword::import))
                throwError (Errors::importsMustBeAtStart());

            parseFunctionOrStateVariable();
        }

        giveErrorOnSemicolon();
    }